

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::set_ip_filter(torrent *this,shared_ptr<const_libtorrent::ip_filter> *ipf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  peVar1 = (ipf->super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  p_Var2 = (ipf->super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (ipf->super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (ipf->super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_ip_filter).
            super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->m_ip_filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (this->m_ip_filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((this->field_0x5db & 2) == 0) {
    return;
  }
  ip_filter_updated(this);
  return;
}

Assistant:

void torrent::set_ip_filter(std::shared_ptr<const ip_filter> ipf)
	{
		m_ip_filter = std::move(ipf);
		if (!m_apply_ip_filter) return;
		ip_filter_updated();
	}